

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::instructionDispatchLoop
          (SelectionEvaluator *this,SelectionSet *bs,int frame)

{
  pointer pTVar1;
  _func_void__Op_any_ptr__Arg_ptr *p_Var2;
  bool bVar3;
  ulong uVar4;
  fd_set *__writefds;
  ulong uVar5;
  fd_set *in_R8;
  timeval *in_R9;
  Token token;
  Token local_50;
  _Arg local_38;
  
  do {
    uVar4 = (ulong)this->pc;
    __writefds = (fd_set *)
                 (this->aatoken).
                 super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->aatoken).
                   super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)__writefds >> 3) *
            -0x5555555555555555;
    if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
      return;
    }
    this->pc = this->pc + 1;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              (&this->statement,
               (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)
               (__writefds->fds_bits + uVar4 * 3));
    pTVar1 = (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->statementLength =
         (int)((ulong)((long)(this->statement).
                             super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 3) *
         -0x55555555;
    local_50.tok = pTVar1->tok;
    local_50.intValue = pTVar1->intValue;
    local_50.value._M_storage._M_ptr = (void *)0x0;
    p_Var2 = (pTVar1->value)._M_manager;
    if (p_Var2 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_38._M_any = &local_50.value;
      (*p_Var2)(_Op_clone,&pTVar1->value,&local_38);
    }
    if (local_50.tok == 0x302) {
      bVar3 = true;
      select(this,(int)bs,(fd_set *)(ulong)(uint)frame,__writefds,in_R8,in_R9);
    }
    else if (local_50.tok == 0x301) {
      bVar3 = true;
      define(this);
    }
    else {
      unrecognizedCommand(this,&local_50);
      bVar3 = false;
    }
    if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
      local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
  } while (bVar3);
  return;
}

Assistant:

void SelectionEvaluator::instructionDispatchLoop(SelectionSet& bs,
                                                   int frame) {
    while (pc < aatoken.size()) {
      statement       = aatoken[pc++];
      statementLength = statement.size();
      Token token     = statement[0];
      switch (token.tok) {
      case Token::define:
        define();
        break;
      case Token::select:
        select(bs, frame);
        break;
      default:
        unrecognizedCommand(token);
        return;
      }
    }
  }